

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O3

void * AllocUnits(CPpmd8 *p,uint indx)

{
  Byte *pBVar1;
  byte bVar2;
  void *retVal;
  uint *puVar3;
  long lVar4;
  ulong uVar5;
  Byte *pBVar6;
  uint oldIndx;
  uint uVar7;
  ulong uVar8;
  Byte *pBVar9;
  uint uStack_1c;
  
  uVar5 = (ulong)p->FreeList[indx];
  if (uVar5 != 0) {
    pBVar9 = p->Base;
    p->FreeList[indx] = *(CPpmd_Void_Ref *)(pBVar9 + uVar5 + 4);
    p->Stamps[indx] = p->Stamps[indx] - 1;
    return pBVar9 + uVar5;
  }
  lVar4 = (ulong)p->Indx2Units[indx] * 0xc;
  pBVar9 = p->LoUnit;
  if ((uint)(*(int *)&p->HiUnit - (int)pBVar9) < (uint)lVar4) {
    oldIndx = indx;
    if (p->GlueCount == 0) {
      uStack_1c = 0;
      p->GlueCount = 0x2000;
      memset(p->Stamps,0,0x98);
      pBVar9 = p->LoUnit;
      if (pBVar9 != p->HiUnit) {
        pBVar9[0] = '\0';
        pBVar9[1] = '\0';
        pBVar9[2] = '\0';
        pBVar9[3] = '\0';
      }
      puVar3 = &uStack_1c;
      lVar4 = 0;
      do {
        uVar7 = p->FreeList[lVar4];
        p->FreeList[lVar4] = 0;
        if (uVar7 != 0) {
          pBVar9 = p->Base;
          do {
            uVar5 = (ulong)uVar7;
            if (*(int *)(pBVar9 + uVar5 + 8) != 0) {
              *puVar3 = uVar7;
              puVar3 = (uint *)(pBVar9 + uVar5 + 4);
              while( true ) {
                uVar8 = (ulong)*(uint *)(pBVar9 + uVar5 + 8);
                if (*(int *)(pBVar9 + uVar8 * 0xc + uVar5) != -1) break;
                *(uint *)(pBVar9 + uVar5 + 8) =
                     *(uint *)(pBVar9 + uVar5 + 8) + *(int *)(pBVar9 + uVar8 * 0xc + uVar5 + 8);
                pBVar6 = pBVar9 + uVar8 * 0xc + uVar5 + 8;
                pBVar6[0] = '\0';
                pBVar6[1] = '\0';
                pBVar6[2] = '\0';
                pBVar6[3] = '\0';
              }
            }
            uVar7 = *(uint *)(pBVar9 + uVar5 + 4);
          } while (uVar7 != 0);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x26);
      *puVar3 = 0;
      if (uStack_1c != 0) {
        pBVar9 = p->Base;
        do {
          uVar5 = (ulong)uStack_1c;
          uStack_1c = *(uint *)(pBVar9 + uVar5 + 4);
          uVar7 = *(uint *)(pBVar9 + uVar5 + 8);
          if (uVar7 != 0) {
            for (; 0x80 < uVar7; uVar7 = uVar7 - 0x80) {
              pBVar6 = pBVar9 + uVar5;
              pBVar6[0] = 0xff;
              pBVar6[1] = 0xff;
              pBVar6[2] = 0xff;
              pBVar6[3] = 0xff;
              *(CPpmd_Void_Ref *)(pBVar9 + uVar5 + 4) = p->FreeList[0x25];
              *(uint *)(pBVar9 + uVar5 + 8) = (uint)p->Indx2Units[0x25];
              p->FreeList[0x25] = (CPpmd_Void_Ref)uVar5;
              p->Stamps[0x25] = p->Stamps[0x25] + 1;
              uVar5 = uVar5 + 0x600;
            }
            pBVar6 = pBVar9 + uVar5;
            uVar5 = (ulong)p->Units2Indx[uVar7 - 1];
            if (uVar7 != p->Indx2Units[uVar5]) {
              uVar5 = (ulong)(p->Units2Indx[uVar7 - 1] - 1);
              pBVar1 = pBVar6 + (ulong)p->Indx2Units[uVar5] * 0xc;
              uVar7 = uVar7 + ~(uint)p->Indx2Units[uVar5];
              pBVar1[0] = 0xff;
              pBVar1[1] = 0xff;
              pBVar1[2] = 0xff;
              pBVar1[3] = 0xff;
              *(CPpmd_Void_Ref *)(pBVar1 + 4) = p->FreeList[uVar7];
              *(uint *)(pBVar1 + 8) = (uint)p->Indx2Units[uVar7];
              p->FreeList[uVar7] = (int)pBVar1 - (int)pBVar9;
              p->Stamps[uVar7] = p->Stamps[uVar7] + 1;
            }
            pBVar6[0] = 0xff;
            pBVar6[1] = 0xff;
            pBVar6[2] = 0xff;
            pBVar6[3] = 0xff;
            *(CPpmd_Void_Ref *)(pBVar6 + 4) = p->FreeList[uVar5];
            *(uint *)(pBVar6 + 8) = (uint)p->Indx2Units[uVar5];
            p->FreeList[uVar5] = (int)pBVar6 - (int)pBVar9;
            p->Stamps[uVar5] = p->Stamps[uVar5] + 1;
          }
        } while (uStack_1c != 0);
      }
      uVar5 = (ulong)p->FreeList[indx];
      if (uVar5 != 0) {
        pBVar9 = p->Base;
        p->FreeList[indx] = *(CPpmd_Void_Ref *)(pBVar9 + uVar5 + 4);
        p->Stamps[indx] = p->Stamps[indx] - 1;
        return pBVar9 + uVar5;
      }
    }
    do {
      if (oldIndx == 0x25) {
        bVar2 = p->Indx2Units[indx];
        p->GlueCount = p->GlueCount - 1;
        if ((uint)bVar2 * 0xc < (uint)((int)p->UnitsStart - *(int *)&p->Text)) {
          pBVar9 = p->UnitsStart + (ulong)bVar2 * -0xc;
          p->UnitsStart = pBVar9;
          return pBVar9;
        }
        return (void *)0x0;
      }
      oldIndx = oldIndx + 1;
      uVar5 = (ulong)p->FreeList[oldIndx];
    } while (uVar5 == 0);
    pBVar9 = p->Base + uVar5;
    p->FreeList[oldIndx] = *(CPpmd_Void_Ref *)(p->Base + uVar5 + 4);
    p->Stamps[oldIndx] = p->Stamps[oldIndx] - 1;
    SplitBlock(p,pBVar9,oldIndx,indx);
    return pBVar9;
  }
  p->LoUnit = pBVar9 + lVar4;
  return pBVar9;
}

Assistant:

static void *AllocUnits(CPpmd8 *p, unsigned indx)
{
  UInt32 numBytes;
  if (p->FreeList[indx] != 0)
    return RemoveNode(p, indx);
  numBytes = U2B(I2U(indx));
  if (numBytes <= (UInt32)(p->HiUnit - p->LoUnit))
  {
    void *retVal = p->LoUnit;
    p->LoUnit += numBytes;
    return retVal;
  }
  return AllocUnitsRare(p, indx);
}